

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::readBuffer
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          GLFrameBuffer *this)

{
  uint uVar1;
  uint uVar2;
  allocator_type local_19;
  
  (*glad_glFlush)();
  (*glad_glFinish)();
  (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
  uVar1 = (this->super_FrameBuffer).sizeX;
  uVar2 = (this->super_FrameBuffer).sizeY;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)(int)(uVar1 * uVar2 * 4),&local_19);
  (*glad_glReadPixels)
            (0,0,uVar1,uVar2,0x1908,0x1401,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> GLFrameBuffer::readBuffer() {

  glFlush();
  glFinish();

  bind();

  int w = getSizeX();
  int h = getSizeY();

  // Read from openGL
  size_t buffSize = w * h * 4;
  std::vector<unsigned char> buff(buffSize);
  glReadPixels(0, 0, w, h, GL_RGBA, GL_UNSIGNED_BYTE, &(buff.front()));

  return buff;
}